

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiInputReadMode mode;
  float *pfVar5;
  int in_ECX;
  int in_EDX;
  uint uVar6;
  int *in_RSI;
  int in_EDI;
  char *in_R8;
  uint in_R9D;
  bool bVar7;
  bool bVar8;
  float in_XMM0_Da;
  float rhs;
  float in_XMM1_Da;
  float v_cur_norm_curved;
  float v_new_norm_curved;
  float v_old_norm_curved;
  float v_old_ref_for_accum_remainder;
  int v_cur;
  bool is_drag_direction_change_with_power;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_locked;
  bool is_power;
  bool is_clamped;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiContext *g;
  size_t in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff89;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff94;
  bool bVar9;
  float local_5c;
  int local_58;
  undefined8 in_stack_ffffffffffffffb0;
  float fVar10;
  float local_14;
  bool local_1;
  
  pIVar3 = GImGui;
  uVar6 = in_R9D & 1;
  bVar7 = in_EDI == 8;
  bVar8 = in_EDI == 9;
  bVar1 = in_EDX < in_ECX;
  bVar9 = false;
  if ((((in_XMM1_Da != 1.0) || (NAN(in_XMM1_Da))) && (bVar9 = false, bVar7 || bVar8)) &&
     (bVar9 = false, bVar1)) {
    bVar9 = (float)(in_ECX - in_EDX) < 3.4028235e+38;
  }
  if (in_ECX < in_EDX) {
    local_1 = false;
  }
  else {
    local_14 = in_XMM0_Da;
    if (((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) &&
       ((bVar1 && ((float)(in_ECX - in_EDX) < 3.4028235e+38)))) {
      local_14 = (float)(in_ECX - in_EDX) * GImGui->DragSpeedDefaultRatio;
    }
    fVar10 = 0.0;
    if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
        (bVar4 = IsMousePosValid((ImVec2 *)
                                 CONCAT17(bVar7 || bVar8,
                                          CONCAT16(bVar9,CONCAT24(in_stack_ffffffffffffff94,
                                                                  in_stack_ffffffffffffff90)))),
        !bVar4)) || ((pIVar3->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
        if (bVar7 || bVar8) {
          mode = ImParseFormatPrecision
                           ((char *)CONCAT44(in_stack_ffffffffffffff8c,
                                             CONCAT13(in_stack_ffffffffffffff8b,
                                                      CONCAT12(in_stack_ffffffffffffff8a,
                                                               CONCAT11(in_stack_ffffffffffffff89,
                                                                        in_stack_ffffffffffffff88)))
                                            ),
                            CONCAT13(in_stack_ffffffffffffff87,
                                     CONCAT12(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84)))
          ;
        }
        else {
          mode = ImGuiInputReadMode_Down;
        }
        GetNavInputAmount2d((ImGuiNavDirSourceFlags)fVar10,mode,
                            (float)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                            (float)in_stack_ffffffffffffffb0);
        pfVar5 = ImVec2::operator[]((ImVec2 *)
                                    CONCAT17(in_stack_ffffffffffffff87,
                                             CONCAT16(in_stack_ffffffffffffff86,
                                                      CONCAT24(in_stack_ffffffffffffff84,
                                                               in_stack_ffffffffffffff80))),
                                    in_stack_ffffffffffffff78);
        fVar10 = *pfVar5;
        rhs = GetMinimumStepAtDecimalPrecision(in_stack_ffffffffffffff80);
        local_14 = ImMax<float>(local_14,rhs);
      }
    }
    else {
      pfVar5 = ImVec2::operator[]((ImVec2 *)
                                  CONCAT17(in_stack_ffffffffffffff87,
                                           CONCAT16(in_stack_ffffffffffffff86,
                                                    CONCAT24(in_stack_ffffffffffffff84,
                                                             in_stack_ffffffffffffff80))),
                                  in_stack_ffffffffffffff78);
      fVar10 = *pfVar5;
      if (((pIVar3->IO).KeyAlt & 1U) != 0) {
        fVar10 = fVar10 * 0.01;
      }
      if (((pIVar3->IO).KeyShift & 1U) != 0) {
        fVar10 = fVar10 * 10.0;
      }
    }
    local_14 = local_14 * fVar10;
    if (uVar6 != 0) {
      local_14 = -local_14;
    }
    bVar4 = false;
    if ((bVar1) && ((*in_RSI < in_ECX || (bVar4 = true, local_14 <= 0.0)))) {
      bVar4 = *in_RSI <= in_EDX && local_14 < 0.0;
    }
    bVar2 = false;
    if ((bVar9 != false) &&
       (((0.0 <= local_14 || (bVar2 = true, pIVar3->DragCurrentAccum <= 0.0)) &&
        (bVar2 = false, 0.0 < local_14)))) {
      bVar2 = pIVar3->DragCurrentAccum <= 0.0 && pIVar3->DragCurrentAccum != 0.0;
    }
    if ((((pIVar3->ActiveIdIsJustActivated & 1U) != 0) || (bVar4)) || (bVar2)) {
      pIVar3->DragCurrentAccum = 0.0;
      pIVar3->DragCurrentAccumDirty = false;
    }
    else if ((local_14 != 0.0) || (NAN(local_14))) {
      pIVar3->DragCurrentAccum = local_14 + pIVar3->DragCurrentAccum;
      pIVar3->DragCurrentAccumDirty = true;
    }
    if ((pIVar3->DragCurrentAccumDirty & 1U) == 0) {
      local_1 = false;
    }
    else {
      local_5c = 0.0;
      if (bVar9 != false) {
        local_5c = ImPow(0.0,2.777119e-39);
        ImSaturate(local_5c + pIVar3->DragCurrentAccum / (float)(in_ECX - in_EDX));
        ImPow(0.0,2.777232e-39);
      }
      local_58 = RoundScalarWithFormatT<int,int>(in_R8,(ImGuiDataType)in_XMM1_Da,in_R9D);
      pIVar3->DragCurrentAccumDirty = false;
      if (bVar9 == false) {
        pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (float)(local_58 - *in_RSI);
      }
      else {
        fVar10 = ImPow(0.0,2.777444e-39);
        pIVar3->DragCurrentAccum = pIVar3->DragCurrentAccum - (fVar10 - local_5c);
      }
      if (local_58 == 0) {
        local_58 = 0;
      }
      if ((*in_RSI != local_58) && (bVar1)) {
        if ((local_58 < in_EDX) ||
           (((*in_RSI < local_58 && (local_14 < 0.0)) && (!bVar7 && !bVar8)))) {
          local_58 = in_EDX;
        }
        if ((in_ECX < local_58) ||
           (((local_58 < *in_RSI && (0.0 < local_14)) && (!bVar7 && !bVar8)))) {
          local_58 = in_ECX;
        }
      }
      if (*in_RSI == local_58) {
        local_1 = false;
      }
      else {
        *in_RSI = local_58;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}